

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_uhsub16_aarch64(uint32_t a,uint32_t b)

{
  return (a & 0xffff) - (b & 0xffff) >> 1 & 0xffff | ((a >> 0x10) - (b >> 0x10) & 0xfffffffe) << 0xf
  ;
}

Assistant:

uint32_t HELPER(glue(PFX,sub16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b, 0);
    SUB16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}